

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::concat<kj::CappedArray<char,5ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,CappedArray<char,_5UL> *params)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *target;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_38;
  size_t local_20;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_38.ptr = (Branch *)this->size_;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x1;
  sVar1 = _::sum((_ *)&local_38,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_20 = this->size_;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x1;
  sVar1 = _::sum((_ *)&local_20,nums_00);
  heapString((String *)&local_38,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_38);
  Array<char>::~Array((Array<char> *)&local_38);
  local_20 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x1;
  sVar1 = _::sum((_ *)&local_20,nums_01);
  local_38.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_38.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_38);
  Array<kj::StringTree::Branch>::~Array(&local_38);
  target = (char *)(__return_storage_ptr__->text).content.size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->text).content.ptr;
  }
  _::fill<kj::CappedArray<char,5ul>>(target,(CappedArray<char,_5UL> *)this);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}